

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O2

void free_sym_typeinfo(MOJOSHADER_free f,void *d,MOJOSHADER_symbolTypeInfo *typeinfo)

{
  uint i;
  ulong uVar1;
  long lVar2;
  
  lVar2 = 8;
  for (uVar1 = 0; uVar1 < typeinfo->member_count; uVar1 = uVar1 + 1) {
    (*f)(*(void **)((long)typeinfo->members + lVar2 + -8),d);
    free_sym_typeinfo(f,d,(MOJOSHADER_symbolTypeInfo *)((long)&typeinfo->members->name + lVar2));
    lVar2 = lVar2 + 0x28;
  }
  (*f)(typeinfo->members,d);
  return;
}

Assistant:

static void free_sym_typeinfo(MOJOSHADER_free f, void *d,
                              MOJOSHADER_symbolTypeInfo *typeinfo)
{
    unsigned int i;
    for (i = 0; i < typeinfo->member_count; i++)
    {
        f((void *) typeinfo->members[i].name, d);
        free_sym_typeinfo(f, d, &typeinfo->members[i].info);
    } // for
    f((void *) typeinfo->members, d);
}